

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::DelAddressBook(CWallet *this,CTxDestination *address)

{
  long lVar1;
  string_view process_desc;
  byte bVar2;
  WalletDatabase *this_00;
  size_t in_RSI;
  anon_class_16_2_89c2bea1 *in_RDI;
  long in_FS_OFFSET;
  function<bool_(wallet::WalletBatch_&)> *in_stack_ffffffffffffff78;
  CWallet *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  function<bool_(wallet::WalletBatch_&)> *func;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = GetDatabase(in_stack_ffffffffffffff88);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90
            );
  func = (function<bool_(wallet::WalletBatch_&)> *)&stack0xffffffffffffffc8;
  std::function<bool(wallet::WalletBatch&)>::
  function<wallet::CWallet::DelAddressBook(std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>const&)::__0,void>
            ((function<bool_(wallet::WalletBatch_&)> *)this_00,in_RDI);
  process_desc._M_str = (char *)in_stack_ffffffffffffffc8;
  process_desc._M_len = in_RSI;
  bVar2 = RunWithinTxn((WalletDatabase *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),process_desc,
                       func);
  std::function<bool_(wallet::WalletBatch_&)>::~function(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::DelAddressBook(const CTxDestination& address)
{
    return RunWithinTxn(GetDatabase(), /*process_desc=*/"address book entry removal", [&](WalletBatch& batch){
        return DelAddressBookWithDB(batch, address);
    });
}